

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2cirs.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  CESkyCoord cirs_coords;
  CESkyCoord icrs_coords;
  CEExecOptions opts;
  allocator local_3da;
  allocator local_3d9;
  double local_3d8;
  string local_3d0;
  CESkyCoordType local_3ac;
  CEDate local_3a8;
  CESkyCoord local_368;
  double local_338;
  CESkyCoord local_330;
  CEObserver local_300;
  CEExecOptions local_250;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine(&local_250.super_CLOptions,argc,argv);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"ra",&local_3d9);
    local_3d8 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_300);
    CEAngle::Deg((CEAngle *)&local_368,&local_3d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,"dec",&local_3da);
    local_338 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3a8);
    CEAngle::Deg((CEAngle *)&local_3d0,&local_338);
    local_3ac = ICRS;
    CESkyCoord::CESkyCoord(&local_330,(CEAngle *)&local_368,(CEAngle *)&local_3d0,&local_3ac);
    CEAngle::~CEAngle((CEAngle *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3a8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3da);
    CEAngle::~CEAngle((CEAngle *)&local_368);
    std::__cxx11::string::~string((string *)&local_300);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d0,"juliandate",(allocator *)&local_3d8);
    dVar2 = CLOptions::AsDouble(&local_250.super_CLOptions,&local_3d0);
    CEDate::CEDate(&local_3a8,dVar2,JD);
    CEObserver::CEObserver(&local_300);
    CESkyCoord::ConvertToCIRS(&local_368,&local_330,&local_3a8,&local_300);
    CEObserver::~CEObserver(&local_300);
    CEDate::~CEDate(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3d0);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"juliandate",(allocator *)&local_3a8);
    dVar2 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_300);
    PrintResults(&local_330,&local_368,dVar2);
    std::__cxx11::string::~string((string *)&local_300);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3a8);
    CESkyCoord::~CESkyCoord(&local_368);
    CESkyCoord::~CESkyCoord(&local_330);
  }
  CEExecOptions::~CEExecOptions(&local_250);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
    // Get the options from the command line
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Create a CESkyCoord object
    CESkyCoord icrs_coords(CEAngle::Deg(opts.AsDouble("ra")), 
                           CEAngle::Deg(opts.AsDouble("dec")),
                           CESkyCoordType::ICRS);
    
    // Get the coordinates as CIRS
    CESkyCoord cirs_coords = icrs_coords.ConvertToCIRS(opts.AsDouble("juliandate"));
    
    // Print the result
    PrintResults(icrs_coords, cirs_coords, opts.AsDouble("juliandate")) ;

    return 0;
}